

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloorPlanGraph.hpp
# Opt level: O2

void __thiscall
graphProperties::serialize<boost::archive::binary_iarchive>
          (graphProperties *this,binary_iarchive *ar,uint version)

{
  basic_binary_iprimitive<boost::archive::binary_iarchive,_char,_std::char_traits<char>_> *this_00;
  
  this_00 = &(ar->
             super_binary_iarchive_impl<boost::archive::binary_iarchive,_char,_std::char_traits<char>_>
             ).
             super_basic_binary_iprimitive<boost::archive::binary_iarchive,_char,_std::char_traits<char>_>
  ;
  boost::archive::
  basic_binary_iprimitive<boost::archive::binary_iarchive,char,std::char_traits<char>>::load
            ((string *)this_00);
  boost::archive::
  basic_binary_iprimitive<boost::archive::binary_iarchive,char,std::char_traits<char>>::load
            ((string *)this_00);
  boost::archive::
  basic_binary_iprimitive<boost::archive::binary_iarchive,_char,_std::char_traits<char>_>::
  load<double>(this_00,&this->maxx);
  boost::archive::
  basic_binary_iprimitive<boost::archive::binary_iarchive,_char,_std::char_traits<char>_>::
  load<double>(this_00,&this->maxy);
  boost::archive::
  basic_binary_iprimitive<boost::archive::binary_iarchive,_char,_std::char_traits<char>_>::
  load<double>(this_00,&this->minx);
  boost::archive::
  basic_binary_iprimitive<boost::archive::binary_iarchive,_char,_std::char_traits<char>_>::
  load<double>(this_00,&this->minx);
  boost::archive::detail::load_non_pointer_type<boost::archive::binary_iarchive>::load_standard::
  invoke<Point2D>(ar,&this->centroid);
  return;
}

Assistant:

void serialize(Archive &ar, const unsigned int version)
        {

            ar & floorname;
            ar & filepath;
            ar & maxx;
            ar & maxy;
            ar & minx;
            ar & minx;
            ar & centroid;
        }